

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

void __thiscall Image::displayImage(Image *this)

{
  string window_name;
  long *local_50 [2];
  long local_40 [2];
  _InputArray local_30;
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"GNG","");
  cv::namedWindow((string *)local_50,0);
  local_30.sz.width = 0;
  local_30.sz.height = 0;
  local_30.flags = 0x1010000;
  local_30.obj = this;
  cv::imshow((string *)local_50,&local_30);
  cv::waitKey(0);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void Image::displayImage() {
    std::string window_name = "GNG";
    cv::namedWindow(window_name, cv::WINDOW_NORMAL);
    cv::imshow(window_name, content);
    cv::waitKey(0);
}